

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime.cpp
# Opt level: O1

void duckdb::StrpTimeFunction::TryParse<duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  unsigned_long *puVar1;
  BoundFunctionExpression *pBVar2;
  pointer pFVar3;
  reference pvVar4;
  pointer local_20;
  
  pBVar2 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  pFVar3 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->(&pBVar2->bind_info);
  pvVar4 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  if (pvVar4->vector_type == CONSTANT_VECTOR) {
    pvVar4 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
    puVar1 = (pvVar4->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      ConstantVector::SetNull(result,true);
      return;
    }
  }
  pvVar4 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  local_20 = pFVar3;
  UnaryExecutor::
  ExecuteStandard<duckdb::string_t,duckdb::timestamp_t,duckdb::UnaryLambdaWrapperWithNulls,duckdb::StrpTimeFunction::TryParse<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::ValidityMask&,unsigned_long)_1_>
            (pvVar4,result,args->count,&local_20,true,CAN_THROW_RUNTIME_ERROR);
  return;
}

Assistant:

static void TryParse(DataChunk &args, ExpressionState &state, Vector &result) {
		auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
		auto &info = func_expr.bind_info->Cast<StrpTimeBindData>();

		if (args.data[1].GetVectorType() == VectorType::CONSTANT_VECTOR && ConstantVector::IsNull(args.data[1])) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return;
		}

		UnaryExecutor::ExecuteWithNulls<string_t, T>(args.data[0], result, args.size(),
		                                             [&](string_t input, ValidityMask &mask, idx_t idx) {
			                                             T result;
			                                             string error;
			                                             for (auto &format : info.formats) {
				                                             if (StrpTimeTryResult(format, input, result, error)) {
					                                             return result;
				                                             }
			                                             }

			                                             mask.SetInvalid(idx);
			                                             return T();
		                                             });
	}